

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::H2V1Convert(jpeg_decoder *this)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  uint8 *puVar6;
  int iVar7;
  uint8 *puVar8;
  uint8 *puVar9;
  uint8 *puVar10;
  int j;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint8 *puVar15;
  int iVar16;
  bool bVar17;
  
  if (0 < this->m_max_mcus_per_row) {
    lVar5 = (long)this->m_max_mcu_y_size - (long)this->m_mcu_lines_left;
    puVar8 = this->m_pSample_buf + lVar5 * 8 + 0x80;
    puVar10 = this->m_pSample_buf + lVar5 * 8;
    puVar6 = this->m_pScan_line_0;
    iVar2 = this->m_max_mcus_per_row;
    do {
      iVar4 = 0;
      do {
        puVar15 = puVar10;
        puVar9 = puVar8;
        lVar5 = 0;
        puVar10 = puVar6;
        do {
          puVar8 = puVar10;
          iVar16 = this->m_crr[puVar9[lVar5 + 0x40]];
          uVar12 = (uint)puVar15[lVar5 * 2];
          iVar13 = iVar16 + uVar12;
          iVar7 = 0;
          if (iVar13 < 1) {
            iVar13 = iVar7;
          }
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          iVar11 = this->m_cbg[puVar9[lVar5]] + this->m_crg[puVar9[lVar5 + 0x40]] >> 0x10;
          iVar14 = this->m_cbb[puVar9[lVar5]];
          puVar6[lVar5 * 8] = (uint8)iVar13;
          iVar13 = iVar11 + uVar12;
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          puVar6[lVar5 * 8 + 1] = (uint8)iVar13;
          iVar13 = uVar12 + iVar14;
          if (iVar13 < 1) {
            iVar13 = iVar7;
          }
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          puVar6[lVar5 * 8 + 2] = (uint8)iVar13;
          puVar6[lVar5 * 8 + 3] = 0xff;
          bVar1 = puVar15[lVar5 * 2 + 1];
          iVar16 = iVar16 + (uint)bVar1;
          if (iVar16 < 1) {
            iVar16 = iVar7;
          }
          if (0xfe < iVar16) {
            iVar16 = 0xff;
          }
          puVar6[lVar5 * 8 + 4] = (uint8)iVar16;
          iVar11 = iVar11 + (uint)bVar1;
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          puVar6[lVar5 * 8 + 5] = (uint8)iVar11;
          iVar14 = iVar14 + (uint)bVar1;
          if (0 < iVar14) {
            iVar7 = iVar14;
          }
          if (0xfe < iVar7) {
            iVar7 = 0xff;
          }
          lVar3 = lVar5 * 8;
          puVar6[lVar5 * 8 + 6] = (uint8)iVar7;
          puVar6[lVar5 * 8 + 7] = 0xff;
          lVar5 = lVar5 + 1;
          puVar10 = puVar6 + lVar3 + 8;
        } while (lVar5 != 4);
        puVar6 = puVar8 + 8;
        bVar17 = iVar4 == 0;
        puVar8 = puVar9 + 4;
        puVar10 = puVar15 + 0x40;
        iVar4 = iVar4 + 1;
      } while (bVar17);
      puVar10 = puVar15 + 0xc0;
      puVar8 = puVar9 + 0xfc;
      bVar17 = 1 < iVar2;
      iVar2 = iVar2 + -1;
    } while (bVar17);
  }
  return;
}

Assistant:

void jpeg_decoder::H2V1Convert()
	{
		int row = m_max_mcu_y_size - m_mcu_lines_left;
		uint8* d0 = m_pScan_line_0;
		uint8* y = m_pSample_buf + row * 8;
		uint8* c = m_pSample_buf + 2 * 64 + row * 8;

		for (int i = m_max_mcus_per_row; i > 0; i--)
		{
			for (int l = 0; l < 2; l++)
			{
				for (int j = 0; j < 4; j++)
				{
					int cb = c[0];
					int cr = c[64];

					int rc = m_crr[cr];
					int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
					int bc = m_cbb[cb];

					int yy = y[j << 1];
					d0[0] = clamp(yy + rc);
					d0[1] = clamp(yy + gc);
					d0[2] = clamp(yy + bc);
					d0[3] = 255;

					yy = y[(j << 1) + 1];
					d0[4] = clamp(yy + rc);
					d0[5] = clamp(yy + gc);
					d0[6] = clamp(yy + bc);
					d0[7] = 255;

					d0 += 8;

					c++;
				}
				y += 64;
			}

			y += 64 * 4 - 64 * 2;
			c += 64 * 4 - 8;
		}
	}